

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resizable_buffer.hpp
# Opt level: O2

double __thiscall duckdb::ByteBuffer::read<double>(ByteBuffer *this)

{
  double dVar1;
  
  available(this,8);
  dVar1 = *(double *)this->ptr;
  this->len = this->len - 8;
  this->ptr = (data_ptr_t)((long)this->ptr + 8);
  return dVar1;
}

Assistant:

T read() {
		available(sizeof(T));
		return unsafe_read<T>();
	}